

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  uint uVar1;
  size_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  ulong in_RSI;
  ZSTD_CDict *in_RDI;
  int in_R8D;
  ZSTD_dictContentType_e in_stack_00000020;
  ZSTD_dictLoadMethod_e in_stack_00000024;
  size_t in_stack_00000028;
  void *in_stack_00000030;
  void *ptr;
  ZSTD_CDict *cdict;
  size_t neededSize;
  size_t matchStateSize;
  size_t local_60;
  ZSTD_CDict *local_50;
  ZSTD_CDict *local_8;
  
  sVar2 = ZSTD_sizeof_matchState((ZSTD_compressionParameters *)&stack0x00000008,0);
  local_60 = in_RCX;
  if (in_R8D == 1) {
    local_60 = 0;
  }
  if (((ulong)in_RDI & 7) == 0) {
    if (in_RSI < local_60 + 0x2b00 + sVar2) {
      local_8 = (ZSTD_CDict *)0x0;
    }
    else {
      if (in_R8D == 0) {
        memcpy(in_RDI + 1,in_RDX,in_RCX);
        local_50 = (ZSTD_CDict *)((long)&in_RDI[1].dictBuffer + in_RCX);
      }
      else {
        local_50 = in_RDI + 1;
      }
      in_RDI->workspace = local_50;
      in_RDI->workspaceSize = sVar2 + 0x1800;
      cParams_00.hashLog = dictContentType;
      cParams_00._0_8_ = matchStateSize;
      cParams_00.searchLog = dictLoadMethod;
      cParams_00._16_8_ = dictSize;
      cParams_00.strategy = (ZSTD_strategy)dict;
      ZSTD_initCDict_internal
                ((ZSTD_CDict *)ptr,in_stack_00000030,in_stack_00000028,in_stack_00000024,
                 in_stack_00000020,cParams_00);
      uVar1 = ZSTD_isError(0x28c6e4);
      local_8 = in_RDI;
      if (uVar1 != 0) {
        local_8 = (ZSTD_CDict *)0x0;
      }
    }
  }
  else {
    local_8 = (ZSTD_CDict *)0x0;
  }
  return local_8;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = sizeof(ZSTD_CDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize)
                            + HUF_WORKSPACE_SIZE + matchStateSize;
    ZSTD_CDict* const cdict = (ZSTD_CDict*) workspace;
    void* ptr;
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (U32)workspaceSize, (U32)neededSize, (U32)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(cdict+1, dict, dictSize);
        dict = cdict+1;
        ptr = (char*)workspace + sizeof(ZSTD_CDict) + dictSize;
    } else {
        ptr = cdict+1;
    }
    cdict->workspace = ptr;
    cdict->workspaceSize = HUF_WORKSPACE_SIZE + matchStateSize;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}